

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t Crap8(uint8_t *key,uint32_t len,uint32_t seed)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  
  uVar3 = seed + len;
  uVar2 = len + 0x97e1cc59;
  if (7 < len) {
    do {
      uVar2 = uVar2 ^ (uint)((ulong)*(uint *)key * 0x83d2e73b) ^
                      (uint)((ulong)*(uint *)((long)key + 4) * 0x83d2e73b);
      uVar3 = (uint)((ulong)*(uint *)((long)key + 4) * 0x83d2e73b >> 0x20) ^
              ((uint)((ulong)*(uint *)key * 0x83d2e73b >> 0x20) ^ uVar3 * -0x7c2d18c5) * -0x7c2d18c5
      ;
      key = (uint8_t *)((long)key + 8);
      len = len - 8;
    } while (7 < len);
  }
  if (3 < len) {
    uVar2 = uVar2 ^ (uint)((ulong)*(uint *)key * 0x83d2e73b);
    uVar3 = (uint)((ulong)*(uint *)key * 0x83d2e73b >> 0x20) ^ uVar3 * -0x7c2d18c5;
    key = (uint8_t *)((long)key + 4);
    len = len - 4;
  }
  if (len != 0) {
    bVar5 = (byte)(len << 3);
    sVar1 = (bVar5 < 0x21) * (' ' - bVar5);
    lVar4 = (ulong)((*(uint *)key << sVar1) >> sVar1) * 0x83d2e73b;
    uVar2 = uVar2 ^ (uint)lVar4;
    uVar3 = (uint)((ulong)lVar4 >> 0x20) ^ uVar3 * -0x7c2d18c5;
  }
  lVar4 = (ulong)(uVar3 ^ uVar2) * 0x97e1cc59;
  return (uint)lVar4 ^ uVar2 ^ (uint)((ulong)lVar4 >> 0x20);
}

Assistant:

uint32_t
Crap8(const uint8_t * key, uint32_t len, uint32_t seed)
{
#define c8fold( a, b, y, z ) { p = (uint32_t)(a) * (uint64_t)(b); y ^= (uint32_t)p; z ^= (uint32_t)(p >> 32); }
#define c8mix( in ) { h *= m; c8fold( in, m, k, h ); }

  const uint32_t  m = 0x83d2e73b, n = 0x97e1cc59, *key4 = (const uint32_t *)key;
  uint32_t	  h = len + seed, k = n + len;
  uint64_t	  p;

  while (len >= 8) {
    c8mix(key4[0]) c8mix(key4[1]) key4 += 2;
    len -= 8;
  }
  if (len >= 4) {
    c8mix(key4[0]) key4 += 1;
    len -= 4;
  }
  if (len) {
    c8mix(key4[0] & ((1 << (len * 8)) - 1))
  }
  c8fold(h ^ k, n, k, k)
  return k;
}